

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerUtil.cpp
# Opt level: O2

ByteString * DERUTIL::octet2Raw(ByteString *__return_storage_ptr__,ByteString *byteString)

{
  byte bVar1;
  size_t sVar2;
  uchar *puVar3;
  byte *pbVar4;
  size_t sVar5;
  unsigned_long uVar6;
  int lineNo;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ByteString repr;
  ByteString length;
  ByteString rv;
  
  ByteString::ByteString(&rv);
  ByteString::ByteString(&repr,byteString);
  sVar2 = ByteString::size(&repr);
  if (sVar2 < 2) {
    pcVar7 = "Undersized octet string";
    lineNo = 0x54;
  }
  else {
    puVar3 = ByteString::operator[](&repr,0);
    if (*puVar3 == '\x04') {
      puVar3 = ByteString::operator[](&repr,1);
      if ((char)*puVar3 < '\0') {
        pbVar4 = ByteString::operator[](&repr,1);
        bVar1 = *pbVar4;
        sVar5 = ByteString::size(&repr);
        uVar9 = (ulong)(bVar1 & 0x7f) + 2;
        if (sVar5 <= uVar9) {
          softHSMLog(3,"octet2Raw",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                     ,0x79,"Undersized octet string");
          ByteString::ByteString(__return_storage_ptr__,&rv);
          goto LAB_0012b1ea;
        }
        puVar3 = ByteString::operator[](&repr,2);
        ByteString::ByteString(&length,puVar3,(ulong)(bVar1 & 0x7f));
        uVar6 = ByteString::long_val(&length);
        uVar8 = sVar2 - uVar9;
        if (uVar6 != uVar8) {
          uVar6 = ByteString::long_val(&length);
          pcVar7 = "Overrun octet string";
          if (uVar8 > uVar6) {
            pcVar7 = "Underrun octet string";
          }
          softHSMLog(3,"octet2Raw",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                     ,(uint)(uVar8 <= uVar6) * 4 + 0x84,pcVar7);
          ByteString::ByteString(__return_storage_ptr__,&rv);
          ByteString::~ByteString(&length);
          goto LAB_0012b1ea;
        }
        ByteString::~ByteString(&length);
      }
      else {
        pbVar4 = ByteString::operator[](&repr,1);
        uVar9 = sVar2 - 2;
        if (uVar9 != *pbVar4) {
          pbVar4 = ByteString::operator[](&repr,1);
          lineNo = (uint)(uVar9 <= *pbVar4) * 4 + 0x67;
          pcVar7 = "Overrun octet string";
          if (*pbVar4 < uVar9) {
            pcVar7 = "Underrun octet string";
          }
          goto LAB_0012b1c5;
        }
        uVar9 = 2;
      }
      ByteString::substr(__return_storage_ptr__,&repr,uVar9,sVar2 - uVar9);
      goto LAB_0012b1ea;
    }
    pcVar7 = "ByteString is not an octet string";
    lineNo = 0x5b;
  }
LAB_0012b1c5:
  softHSMLog(3,"octet2Raw",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
             ,lineNo,pcVar7);
  ByteString::ByteString(__return_storage_ptr__,&rv);
LAB_0012b1ea:
  ByteString::~ByteString(&repr);
  ByteString::~ByteString(&rv);
  return __return_storage_ptr__;
}

Assistant:

ByteString DERUTIL::octet2Raw(const ByteString& byteString)
{
	ByteString rv;
	ByteString repr = byteString;
	size_t len = repr.size();
	size_t controlOctets = 2;

	if (len < controlOctets)
	{
		ERROR_MSG("Undersized octet string");

		return rv;
	}

	if (repr[0] != 0x04)
	{
		ERROR_MSG("ByteString is not an octet string");

		return rv;
	}

	// Definite, short
	if (repr[1] < 0x80)
	{
		if (repr[1] != (len - controlOctets))
		{
			if (repr[1] < (len - controlOctets))
			{
				ERROR_MSG("Underrun octet string");
			}
			else
			{
				ERROR_MSG("Overrun octet string");
			}

			return rv;
		}
	}
	// Definite, long
	else
	{
		size_t lengthOctets = repr[1] & 0x7f;
		controlOctets += lengthOctets;

		if (controlOctets >= repr.size())
		{
			ERROR_MSG("Undersized octet string");

			return rv;
		}

		ByteString length(&repr[2], lengthOctets);

		if (length.long_val() != (len - controlOctets))
                {
			if (length.long_val() < (len - controlOctets))
			{
				ERROR_MSG("Underrun octet string");
			}
			else
			{
				ERROR_MSG("Overrun octet string");
			}

			return rv;
		}
	}

	return repr.substr(controlOctets, len - controlOctets);
}